

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O0

ssize_t __thiscall Sound_Queue::write(Sound_Queue *this,int __fd,void *__buf,size_t __n)

{
  sample_t *psVar1;
  undefined4 in_register_00000034;
  int n;
  int in_stack_ffffffffffffffdc;
  Sound_Queue *this_00;
  int local_18;
  int local_14;
  void *local_10;
  
  local_10 = (void *)CONCAT44(in_register_00000034,__fd);
  local_14 = (int)__buf;
  this_00 = this;
  while (local_14 != 0) {
    local_18 = 0x800 - this_00->write_pos;
    if (local_14 < local_18) {
      local_18 = local_14;
    }
    psVar1 = buf(this_00,in_stack_ffffffffffffffdc);
    this = this_00;
    memcpy(psVar1 + this_00->write_pos,local_10,(long)local_18 << 1);
    local_10 = (void *)((long)local_10 + (long)local_18 * 2);
    this->write_pos = local_18 + this->write_pos;
    local_14 = local_14 - local_18;
    this_00 = this;
    if (0x7ff < this->write_pos) {
      this->write_pos = 0;
      this->write_buf = (this->write_buf + 1) % 3;
      this = (Sound_Queue *)SDL_SemWait(this->free_sem);
    }
  }
  return (ssize_t)this;
}

Assistant:

void Sound_Queue::write( const sample_t* in, int count )
{
	while ( count )
	{
		int n = buf_size - write_pos;
		if ( n > count )
			n = count;
		
		memcpy( buf( write_buf ) + write_pos, in, n * sizeof (sample_t) );
		in += n;
		write_pos += n;
		count -= n;
		
		if ( write_pos >= buf_size )
		{
			write_pos = 0;
			write_buf = (write_buf + 1) % buf_count;
			SDL_SemWait( free_sem );
		}
	}
}